

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw_gl3.cpp
# Opt level: O1

void ImGui_ImplGlfwGL3_NewFrame(void)

{
  double dVar1;
  int iVar2;
  ImGuiMouseCursor IVar3;
  ImGuiIO *pIVar4;
  float *pfVar5;
  uchar *puVar6;
  GLFWcursor *cursorHandle;
  int i;
  long lVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  double mouse_x;
  double mouse_y;
  int display_h;
  int display_w;
  int h;
  int w;
  undefined8 local_48;
  undefined8 local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  if (g_FontTexture == 0) {
    ImGui_ImplGlfwGL3_CreateDeviceObjects();
  }
  pIVar4 = ImGui::GetIO();
  glfwGetWindowSize(g_Window,&local_2c,&local_30);
  glfwGetFramebufferSize(g_Window,&local_34,&local_38);
  (pIVar4->DisplaySize).x = (float)local_2c;
  (pIVar4->DisplaySize).y = (float)local_30;
  fVar10 = (float)local_34 / (float)local_2c;
  if (local_2c < 1) {
    fVar10 = 0.0;
  }
  fVar9 = (float)local_38 / (float)local_30;
  if (local_30 < 1) {
    fVar9 = 0.0;
  }
  (pIVar4->DisplayFramebufferScale).x = fVar10;
  (pIVar4->DisplayFramebufferScale).y = fVar9;
  dVar1 = glfwGetTime();
  if (0.0 < g_Time) {
    fVar10 = (float)(dVar1 - g_Time);
  }
  else {
    fVar10 = 0.016666668;
  }
  pIVar4->DeltaTime = fVar10;
  g_Time = dVar1;
  iVar2 = glfwGetWindowAttrib(g_Window,0x20001);
  if (iVar2 == 0) {
    (pIVar4->MousePos).x = -3.4028235e+38;
    (pIVar4->MousePos).y = -3.4028235e+38;
  }
  else if (pIVar4->WantSetMousePos == true) {
    glfwSetCursorPos(g_Window,(double)(pIVar4->MousePos).x,(double)(pIVar4->MousePos).y);
  }
  else {
    glfwGetCursorPos(g_Window,(double *)&local_48,(double *)&local_40);
    (pIVar4->MousePos).x = (float)(double)CONCAT44(local_48._4_4_,(int)local_48);
    (pIVar4->MousePos).y = (float)(double)CONCAT44(local_40._4_4_,(int)local_40);
  }
  lVar7 = 0;
  do {
    bVar8 = true;
    if (g_MouseJustPressed[lVar7] == false) {
      iVar2 = glfwGetMouseButton(g_Window,(int)lVar7);
      bVar8 = iVar2 != 0;
    }
    pIVar4->MouseDown[lVar7] = bVar8;
    g_MouseJustPressed[lVar7] = false;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  if ((pIVar4->ConfigFlags & 0x20) == 0) {
    iVar2 = glfwGetInputMode(g_Window,0x33001);
    if (iVar2 != 0x34003) {
      IVar3 = ImGui::GetMouseCursor();
      if ((IVar3 == -1) || (pIVar4->MouseDrawCursor != false)) {
        iVar2 = 0x34002;
      }
      else {
        cursorHandle = g_MouseCursors[IVar3];
        if (g_MouseCursors[IVar3] == (GLFWcursor *)0x0) {
          cursorHandle = g_MouseCursors[0];
        }
        glfwSetCursor(g_Window,cursorHandle);
        iVar2 = 0x34001;
      }
      glfwSetInputMode(g_Window,0x33001,iVar2);
    }
  }
  pIVar4->NavInputs[0x10] = 0.0;
  pIVar4->NavInputs[0x11] = 0.0;
  pIVar4->NavInputs[0x12] = 0.0;
  pIVar4->NavInputs[0x13] = 0.0;
  pIVar4->NavInputs[0xc] = 0.0;
  pIVar4->NavInputs[0xd] = 0.0;
  pIVar4->NavInputs[0xe] = 0.0;
  pIVar4->NavInputs[0xf] = 0.0;
  pIVar4->NavInputs[8] = 0.0;
  pIVar4->NavInputs[9] = 0.0;
  pIVar4->NavInputs[10] = 0.0;
  pIVar4->NavInputs[0xb] = 0.0;
  pIVar4->NavInputs[4] = 0.0;
  pIVar4->NavInputs[5] = 0.0;
  pIVar4->NavInputs[6] = 0.0;
  pIVar4->NavInputs[7] = 0.0;
  pIVar4->NavInputs[0] = 0.0;
  pIVar4->NavInputs[1] = 0.0;
  pIVar4->NavInputs[2] = 0.0;
  pIVar4->NavInputs[3] = 0.0;
  pIVar4->NavInputs[0x14] = 0.0;
  if ((pIVar4->ConfigFlags & 2) != 0) {
    local_48._0_4_ = 0;
    local_40._0_4_ = 0;
    pfVar5 = glfwGetJoystickAxes(0,(int *)&local_48);
    puVar6 = glfwGetJoystickButtons(0,(int *)&local_40);
    if ((0 < (int)local_40) && (*puVar6 == '\x01')) {
      pIVar4->NavInputs[0] = 1.0;
    }
    if ((1 < (int)local_40) && (puVar6[1] == '\x01')) {
      pIVar4->NavInputs[1] = 1.0;
    }
    if ((2 < (int)local_40) && (puVar6[2] == '\x01')) {
      pIVar4->NavInputs[3] = 1.0;
    }
    if ((3 < (int)local_40) && (puVar6[3] == '\x01')) {
      pIVar4->NavInputs[2] = 1.0;
    }
    if ((0xd < (int)local_40) && (puVar6[0xd] == '\x01')) {
      pIVar4->NavInputs[4] = 1.0;
    }
    if ((0xb < (int)local_40) && (puVar6[0xb] == '\x01')) {
      pIVar4->NavInputs[5] = 1.0;
    }
    if ((10 < (int)local_40) && (puVar6[10] == '\x01')) {
      pIVar4->NavInputs[6] = 1.0;
    }
    if ((0xc < (int)local_40) && (puVar6[0xc] == '\x01')) {
      pIVar4->NavInputs[7] = 1.0;
    }
    if ((4 < (int)local_40) && (puVar6[4] == '\x01')) {
      pIVar4->NavInputs[0xc] = 1.0;
    }
    if ((5 < (int)local_40) && (puVar6[5] == '\x01')) {
      pIVar4->NavInputs[0xd] = 1.0;
    }
    if ((4 < (int)local_40) && (puVar6[4] == '\x01')) {
      pIVar4->NavInputs[0xe] = 1.0;
    }
    if ((5 < (int)local_40) && (puVar6[5] == '\x01')) {
      pIVar4->NavInputs[0xf] = 1.0;
    }
    if ((int)local_48 < 1) {
      fVar10 = 0.0;
    }
    else {
      fVar10 = *pfVar5 + 0.3;
    }
    fVar9 = 1.0;
    if (fVar10 / -0.59999996 <= 1.0) {
      fVar9 = fVar10 / -0.59999996;
    }
    if (pIVar4->NavInputs[8] <= fVar9 && fVar9 != pIVar4->NavInputs[8]) {
      pIVar4->NavInputs[8] = fVar9;
    }
    if ((int)local_48 < 1) {
      fVar10 = 0.0;
    }
    else {
      fVar10 = *pfVar5 + -0.3;
    }
    fVar9 = 1.0;
    if (fVar10 / 0.59999996 <= 1.0) {
      fVar9 = fVar10 / 0.59999996;
    }
    if (pIVar4->NavInputs[9] <= fVar9 && fVar9 != pIVar4->NavInputs[9]) {
      pIVar4->NavInputs[9] = fVar9;
    }
    fVar10 = 0.0;
    if (1 < (int)local_48) {
      fVar10 = pfVar5[1] + -0.3;
    }
    fVar9 = 1.0;
    if (fVar10 / 0.59999996 <= 1.0) {
      fVar9 = fVar10 / 0.59999996;
    }
    if (pIVar4->NavInputs[10] <= fVar9 && fVar9 != pIVar4->NavInputs[10]) {
      pIVar4->NavInputs[10] = fVar9;
    }
    fVar10 = 0.0;
    if (1 < (int)local_48) {
      fVar10 = pfVar5[1] + 0.3;
    }
    fVar9 = 1.0;
    if (fVar10 / -0.59999996 <= 1.0) {
      fVar9 = fVar10 / -0.59999996;
    }
    if (pIVar4->NavInputs[0xb] <= fVar9 && fVar9 != pIVar4->NavInputs[0xb]) {
      pIVar4->NavInputs[0xb] = fVar9;
    }
    pIVar4->BackendFlags =
         (uint)(0 < (int)local_40 && 0 < (int)local_48) | pIVar4->BackendFlags & 0xfffffffeU;
  }
  ImGui::NewFrame();
  return;
}

Assistant:

void ImGui_ImplGlfwGL3_NewFrame()
{
    if (!g_FontTexture)
        ImGui_ImplGlfwGL3_CreateDeviceObjects();

    ImGuiIO& io = ImGui::GetIO();

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    glfwGetWindowSize(g_Window, &w, &h);
    glfwGetFramebufferSize(g_Window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    io.DisplayFramebufferScale = ImVec2(w > 0 ? ((float)display_w / w) : 0, h > 0 ? ((float)display_h / h) : 0);

    // Setup time step
    double current_time =  glfwGetTime();
    io.DeltaTime = g_Time > 0.0 ? (float)(current_time - g_Time) : (float)(1.0f/60.0f);
    g_Time = current_time;

    // Setup inputs
    // (we already got mouse wheel, keyboard keys & characters from glfw callbacks polled in glfwPollEvents())
    if (glfwGetWindowAttrib(g_Window, GLFW_FOCUSED))
    {
        // Set OS mouse position if requested (only used when ImGuiConfigFlags_NavEnableSetMousePos is enabled by user)
        if (io.WantSetMousePos)
        {
            glfwSetCursorPos(g_Window, (double)io.MousePos.x, (double)io.MousePos.y);
        }
        else
        {
            double mouse_x, mouse_y;
            glfwGetCursorPos(g_Window, &mouse_x, &mouse_y);
            io.MousePos = ImVec2((float)mouse_x, (float)mouse_y);
        }
    }
    else
    {
        io.MousePos = ImVec2(-FLT_MAX,-FLT_MAX);
    }

    for (int i = 0; i < 3; i++)
    {
        // If a mouse press event came, always pass it as "mouse held this frame", so we don't miss click-release events that are shorter than 1 frame.
        io.MouseDown[i] = g_MouseJustPressed[i] || glfwGetMouseButton(g_Window, i) != 0;
        g_MouseJustPressed[i] = false;
    }

    // Update OS/hardware mouse cursor if imgui isn't drawing a software cursor
    if ((io.ConfigFlags & ImGuiConfigFlags_NoMouseCursorChange) == 0 && glfwGetInputMode(g_Window, GLFW_CURSOR) != GLFW_CURSOR_DISABLED)
    {
        ImGuiMouseCursor cursor = ImGui::GetMouseCursor();
        if (io.MouseDrawCursor || cursor == ImGuiMouseCursor_None)
        {
            glfwSetInputMode(g_Window, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
        }
        else
        {
            glfwSetCursor(g_Window, g_MouseCursors[cursor] ? g_MouseCursors[cursor] : g_MouseCursors[ImGuiMouseCursor_Arrow]);
            glfwSetInputMode(g_Window, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
        }
    }

    // Gamepad navigation mapping [BETA]
    memset(io.NavInputs, 0, sizeof(io.NavInputs));
    if (io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad)
    {
        // Update gamepad inputs
        #define MAP_BUTTON(NAV_NO, BUTTON_NO)       { if (buttons_count > BUTTON_NO && buttons[BUTTON_NO] == GLFW_PRESS) io.NavInputs[NAV_NO] = 1.0f; }
        #define MAP_ANALOG(NAV_NO, AXIS_NO, V0, V1) { float v = (axes_count > AXIS_NO) ? axes[AXIS_NO] : V0; v = (v - V0) / (V1 - V0); if (v > 1.0f) v = 1.0f; if (io.NavInputs[NAV_NO] < v) io.NavInputs[NAV_NO] = v; }
        int axes_count = 0, buttons_count = 0;
        const float* axes = glfwGetJoystickAxes(GLFW_JOYSTICK_1, &axes_count);
        const unsigned char* buttons = glfwGetJoystickButtons(GLFW_JOYSTICK_1, &buttons_count);
        MAP_BUTTON(ImGuiNavInput_Activate,   0);     // Cross / A
        MAP_BUTTON(ImGuiNavInput_Cancel,     1);     // Circle / B
        MAP_BUTTON(ImGuiNavInput_Menu,       2);     // Square / X
        MAP_BUTTON(ImGuiNavInput_Input,      3);     // Triangle / Y
        MAP_BUTTON(ImGuiNavInput_DpadLeft,   13);    // D-Pad Left
        MAP_BUTTON(ImGuiNavInput_DpadRight,  11);    // D-Pad Right
        MAP_BUTTON(ImGuiNavInput_DpadUp,     10);    // D-Pad Up
        MAP_BUTTON(ImGuiNavInput_DpadDown,   12);    // D-Pad Down
        MAP_BUTTON(ImGuiNavInput_FocusPrev,  4);     // L1 / LB
        MAP_BUTTON(ImGuiNavInput_FocusNext,  5);     // R1 / RB
        MAP_BUTTON(ImGuiNavInput_TweakSlow,  4);     // L1 / LB
        MAP_BUTTON(ImGuiNavInput_TweakFast,  5);     // R1 / RB
        MAP_ANALOG(ImGuiNavInput_LStickLeft, 0,  -0.3f,  -0.9f);
        MAP_ANALOG(ImGuiNavInput_LStickRight,0,  +0.3f,  +0.9f);
        MAP_ANALOG(ImGuiNavInput_LStickUp,   1,  +0.3f,  +0.9f);
        MAP_ANALOG(ImGuiNavInput_LStickDown, 1,  -0.3f,  -0.9f);
        #undef MAP_BUTTON
        #undef MAP_ANALOG
        if (axes_count > 0 && buttons_count > 0) 
            io.BackendFlags |= ImGuiBackendFlags_HasGamepad; 
        else 
            io.BackendFlags &= ~ImGuiBackendFlags_HasGamepad;
    }

    // Start the frame. This call will update the io.WantCaptureMouse, io.WantCaptureKeyboard flag that you can use to dispatch inputs (or not) to your application.
    ImGui::NewFrame();
}